

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::baggage::Baggage_restrictionManagerTest_Test::TestBody
          (Baggage_restrictionManagerTest_Test *this)

{
  __node_base_ptr *this_00;
  bool bVar1;
  type metrics_00;
  SpanContext *this_01;
  StrMap *pSVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  AssertHelper local_588 [8];
  Message local_580 [15];
  allocator local_571;
  key_type local_570;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_3;
  string local_538;
  allocator local_511;
  string local_510;
  AssertHelper local_4f0 [8];
  Message local_4e8 [8];
  size_type local_4e0;
  int local_4d4;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_2;
  string local_4b8;
  allocator local_491;
  string local_490;
  AssertHelper local_470 [8];
  Message local_468 [15];
  allocator local_459;
  key_type local_458;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_420 [8];
  Message local_418 [8];
  size_type local_410;
  int local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  undefined1 local_3a0 [8];
  StrMap baggage;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_348;
  time_point local_328;
  time_point local_320;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  TraceID local_288;
  SpanContext local_278;
  shared_ptr<const_jaegertracing::Tracer> local_1c8;
  Span local_1b8 [8];
  Span span;
  undefined1 local_48 [8];
  BaggageSetter setter;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  local_28;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  TestRestrictionManager manager;
  _func_void___normal_iterator<const_jaegertracing::Tag_ptr,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>___normal_iterator<const_jaegertracing::Tag_ptr,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  *logFn;
  Baggage_restrictionManagerTest_Test *this_local;
  
  anon_unknown_3::TestRestrictionManager::TestRestrictionManager((TestRestrictionManager *)&metrics)
  ;
  jaegertracing::metrics::Metrics::makeNullMetrics();
  metrics_00 = std::
               unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
               ::operator*(&local_28);
  BaggageSetter::BaggageSetter((BaggageSetter *)local_48,(RestrictionManager *)&metrics,metrics_00);
  std::shared_ptr<const_jaegertracing::Tracer>::shared_ptr(&local_1c8,(nullptr_t)0x0);
  TraceID::TraceID(&local_288);
  local_2c8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_2c8._M_h._M_rehash_policy._4_4_ = 0;
  local_2c8._M_h._M_rehash_policy._M_next_resize = 0;
  local_2c8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2c8._M_h._M_element_count = 0;
  local_2c8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_2c8._M_h._M_bucket_count = 0;
  local_2c8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&local_2c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"",&local_2e9);
  SpanContext::SpanContext(&local_278,&local_288,0x7b,0x1c8,'\x01',&local_2c8,&local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,"",&local_311);
  local_320.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_328.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_348.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&local_348);
  baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &baggage._M_h._M_single_bucket;
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::vector
            ((vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)this_00)
  ;
  Span::Span(local_1b8,&local_1c8,&local_278,&local_310,&local_320,&local_328,&local_348,
             (vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)this_00)
  ;
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::~vector
            ((vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             &baggage._M_h._M_single_bucket);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_348);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  SpanContext::~SpanContext(&local_278);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map(&local_2c8);
  std::shared_ptr<const_jaegertracing::Tracer>::~shared_ptr(&local_1c8);
  this_01 = Span::context(local_1b8);
  pSVar2 = SpanContext::baggage_abi_cxx11_(this_01);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_3a0,pSVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"abc",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3e8,"123",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  BaggageSetter::
  setBaggage<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
            ((BaggageSetter *)local_48,local_1b8,(StrMap *)local_3a0,&local_3c0,&local_3e8,
             (anonymous_namespace)::
             log<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
            );
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  local_404 = 1;
  local_410 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_3a0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_400,"1","baggage.size()",&local_404,&local_410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(local_418);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              (local_420,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=(local_420,local_418);
    testing::internal::AssertHelper::~AssertHelper(local_420);
    testing::Message::~Message(local_418);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_458,"abc",&local_459);
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_3a0,&local_458);
    testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
              ((EqHelper<false> *)local_438,"\"123\"","baggage[\"abc\"]",(char (*) [4])0x342762,
               pmVar4);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
    if (!bVar1) {
      testing::Message::Message(local_468);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
      testing::internal::AssertHelper::AssertHelper
                (local_470,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
                 ,0x74,pcVar3);
      testing::internal::AssertHelper::operator=(local_470,local_468);
      testing::internal::AssertHelper::~AssertHelper(local_470);
      testing::Message::~Message(local_468);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_490,"bcd",&local_491);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_4b8,"234",(allocator *)((long)&gtest_ar_2.message_.ptr_ + 7));
      BaggageSetter::
      setBaggage<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
                ((BaggageSetter *)local_48,local_1b8,(StrMap *)local_3a0,&local_490,&local_4b8,
                 (anonymous_namespace)::
                 log<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
                );
      std::__cxx11::string::~string((string *)&local_4b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator((allocator<char> *)&local_491);
      local_4d4 = 1;
      local_4e0 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3a0);
      testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                ((EqHelper<false> *)local_4d0,"1","baggage.size()",&local_4d4,&local_4e0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
      if (!bVar1) {
        testing::Message::Message(local_4e8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
        testing::internal::AssertHelper::AssertHelper
                  (local_4f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
                   ,0x76,pcVar3);
        testing::internal::AssertHelper::operator=(local_4f0,local_4e8);
        testing::internal::AssertHelper::~AssertHelper(local_4f0);
        testing::Message::~Message(local_4e8);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_510,"abc",&local_511);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_538,"1234567890",
                   (allocator *)((long)&gtest_ar_3.message_.ptr_ + 7));
        BaggageSetter::
        setBaggage<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
                  ((BaggageSetter *)local_48,local_1b8,(StrMap *)local_3a0,&local_510,&local_538,
                   (anonymous_namespace)::
                   log<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
                  );
        std::__cxx11::string::~string((string *)&local_538);
        std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
        std::__cxx11::string::~string((string *)&local_510);
        std::allocator<char>::~allocator((allocator<char> *)&local_511);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_570,"abc",&local_571);
        pmVar4 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_3a0,&local_570);
        testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
                  ((EqHelper<false> *)local_550,"\"12345678\"","baggage[\"abc\"]",
                   (char (*) [9])"12345678",pmVar4);
        std::__cxx11::string::~string((string *)&local_570);
        std::allocator<char>::~allocator((allocator<char> *)&local_571);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
        if (!bVar1) {
          testing::Message::Message(local_580);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
          testing::internal::AssertHelper::AssertHelper
                    (local_588,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
                     ,0x78,pcVar3);
          testing::internal::AssertHelper::operator=(local_588,local_580);
          testing::internal::AssertHelper::~AssertHelper(local_588);
          testing::Message::~Message(local_580);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          gtest_ar_1.message_.ptr_._4_4_ = 0;
        }
      }
    }
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_3a0);
  Span::~Span(local_1b8);
  std::
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ::~unique_ptr(&local_28);
  anon_unknown_3::TestRestrictionManager::~TestRestrictionManager
            ((TestRestrictionManager *)&metrics);
  return;
}

Assistant:

TEST(Baggage, restrictionManagerTest)
{
    auto logFn = &log<std::vector<Tag>::const_iterator>;
    TestRestrictionManager manager;
    auto metrics = metrics::Metrics::makeNullMetrics();
    BaggageSetter setter(manager, *metrics);
    Span span(
        nullptr,
        SpanContext(TraceID(),
                    123,
                    456,
                    static_cast<unsigned char>(SpanContext::Flag::kSampled),
                    SpanContext::StrMap()));
    auto baggage = span.context().baggage();
    setter.setBaggage(span, baggage, "abc", "123", logFn);
    ASSERT_EQ(1, baggage.size());
    ASSERT_EQ("123", baggage["abc"]);
    setter.setBaggage(span, baggage, "bcd", "234", logFn);
    ASSERT_EQ(1, baggage.size());
    setter.setBaggage(span, baggage, "abc", "1234567890", logFn);
    ASSERT_EQ("12345678", baggage["abc"]);
}